

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

_Bool Curl_meets_timecondition(Curl_easy *data,time_t timeofdoc)

{
  long lVar1;
  _Bool _Var2;
  char *fmt;
  
  _Var2 = true;
  if ((timeofdoc != 0) && (lVar1 = (data->set).timevalue, lVar1 != 0)) {
    if ((data->set).timecondition == CURL_TIMECOND_IFUNMODSINCE) {
      if (timeofdoc < lVar1) {
        return true;
      }
      fmt = "The requested document is not old enough\n";
    }
    else {
      if (lVar1 < timeofdoc) {
        return true;
      }
      fmt = "The requested document is not new enough\n";
    }
    _Var2 = false;
    Curl_infof(data,fmt);
    (data->info).timecond = true;
  }
  return _Var2;
}

Assistant:

bool Curl_meets_timecondition(struct Curl_easy *data, time_t timeofdoc)
{
  if((timeofdoc == 0) || (data->set.timevalue == 0))
    return TRUE;

  switch(data->set.timecondition) {
  case CURL_TIMECOND_IFMODSINCE:
  default:
    if(timeofdoc <= data->set.timevalue) {
      infof(data,
            "The requested document is not new enough\n");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  case CURL_TIMECOND_IFUNMODSINCE:
    if(timeofdoc >= data->set.timevalue) {
      infof(data,
            "The requested document is not old enough\n");
      data->info.timecond = TRUE;
      return FALSE;
    }
    break;
  }

  return TRUE;
}